

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# form.cpp
# Opt level: O2

void __thiscall cppcms::widgets::base_widget::message(base_widget *this,string *v)

{
  allocator local_b9;
  string_type local_b8;
  basic_message<char> local_98;
  
  this->field_0x1f0 = this->field_0x1f0 | 0x20;
  std::__cxx11::string::string((string *)&local_b8,"NOTRANS",&local_b9);
  booster::locale::basic_message<char>::basic_message(&local_98,&local_b8,v);
  booster::locale::basic_message<char>::operator=(&this->message_,&local_98);
  booster::locale::basic_message<char>::~basic_message(&local_98);
  std::__cxx11::string::~string((string *)&local_b8);
  return;
}

Assistant:

void base_widget::message(std::string v)
{
	has_message_ = 1;
	message_=locale::message("NOTRANS",v);
}